

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezc3d.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall ezc3d::c3d::pointNames_abi_cxx11_(c3d *this)

{
  const_iterator __position;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  Parameters *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *labels_tp;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *labels;
  string *in_stack_fffffffffffffde8;
  iterator in_stack_fffffffffffffdf0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdf8;
  Parameter *in_stack_fffffffffffffe00;
  Group *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe20;
  byte in_stack_fffffffffffffe27;
  Group *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe38;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  string local_150 [32];
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e8;
  string local_e0 [32];
  string local_c0 [39];
  undefined1 local_99 [33];
  int local_78;
  allocator<char> local_71;
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [39];
  undefined1 local_11;
  
  local_11 = 0;
  parameters((c3d *)0x14a494);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
  ParametersNS::Parameters::group
            ((Parameters *)in_stack_fffffffffffffdf0._M_current,in_stack_fffffffffffffde8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
  __position._M_current =
       &ParametersNS::GroupNS::Group::parameter
                  (in_stack_fffffffffffffdf0._M_current,in_stack_fffffffffffffde8)->_name;
  __first._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ParametersNS::GroupNS::Parameter::valuesAsString_abi_cxx11_
                 ((Parameter *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__first._M_current,in_stack_fffffffffffffe38);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  local_78 = 2;
  while( true ) {
    this_00 = parameters((c3d *)0x14a59f);
    __last._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (char *)in_stack_fffffffffffffe28,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
    in_stack_fffffffffffffe28 =
         ParametersNS::Parameters::group
                   ((Parameters *)in_stack_fffffffffffffdf0._M_current,in_stack_fffffffffffffde8);
    std::__cxx11::to_string((int)((ulong)__last._M_current >> 0x20));
    std::operator+((char *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0._M_current);
    in_stack_fffffffffffffe27 =
         ParametersNS::GroupNS::Group::isParameter
                   (in_stack_fffffffffffffe08,&in_stack_fffffffffffffe00->_name);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string((string *)(local_99 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_99);
    if ((in_stack_fffffffffffffe27 & 1) == 0) break;
    parameters((c3d *)0x14a684);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (char *)in_stack_fffffffffffffe28,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
    in_stack_fffffffffffffe08 =
         ParametersNS::Parameters::group
                   ((Parameters *)in_stack_fffffffffffffdf0._M_current,in_stack_fffffffffffffde8);
    std::__cxx11::to_string((int)((ulong)__last._M_current >> 0x20));
    std::operator+((char *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0._M_current);
    in_stack_fffffffffffffe00 =
         ParametersNS::GroupNS::Group::parameter
                   ((Group *)in_stack_fffffffffffffdf0._M_current,in_stack_fffffffffffffde8);
    in_stack_fffffffffffffdf8 =
         ParametersNS::GroupNS::Parameter::valuesAsString_abi_cxx11_
                   ((Parameter *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
    std::__cxx11::string::~string(local_130);
    std::__cxx11::string::~string(local_150);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator(&local_109);
    local_e8 = in_stack_fffffffffffffdf8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffffde8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffdf0._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffde8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffde8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffffde8);
    in_stack_fffffffffffffdf0 =
         std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
         insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_00,__position,__first,__last);
    local_78 = local_78 + 1;
  }
  return in_RDI;
}

Assistant:

const std::vector<std::string> ezc3d::c3d::pointNames() const {
  std::vector<std::string> labels =
      parameters().group("POINT").parameter("LABELS").valuesAsString();
  int i = 2;
  while (
      parameters().group("POINT").isParameter("LABELS" + std::to_string(i))) {
    const std::vector<std::string> &labels_tp =
        parameters()
            .group("POINT")
            .parameter("LABELS" + std::to_string(i))
            .valuesAsString();
    labels.insert(labels.end(), labels_tp.begin(), labels_tp.end());
    ++i;
  }
  return labels;
}